

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O0

bool __thiscall
libcellml::ComponentEntity::containsComponent
          (ComponentEntity *this,string *name,bool searchEncapsulated)

{
  ulong uVar1;
  bool bVar2;
  ComponentEntityImpl *pCVar3;
  size_t sVar4;
  element_type *this_00;
  byte local_61;
  shared_ptr<libcellml::Component> local_48;
  ulong local_38;
  size_t i;
  __normal_iterator<const_std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_28;
  const_iterator result;
  bool status;
  bool searchEncapsulated_local;
  string *name_local;
  ComponentEntity *this_local;
  
  result._M_current._6_1_ = 0;
  result._M_current._7_1_ = searchEncapsulated;
  pCVar3 = pFunc(this);
  local_28._M_current =
       (shared_ptr<libcellml::Component> *)ComponentEntityImpl::findComponent(pCVar3,name);
  pCVar3 = pFunc(this);
  i = (size_t)std::
              vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
              ::end(&pCVar3->mComponents);
  bVar2 = __gnu_cxx::operator!=
                    (&local_28,
                     (__normal_iterator<const_std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
                      *)&i);
  if (bVar2) {
    result._M_current._6_1_ = 1;
  }
  else if ((result._M_current._7_1_ & 1) != 0) {
    local_38 = 0;
    while( true ) {
      uVar1 = local_38;
      sVar4 = componentCount(this);
      local_61 = 0;
      if (uVar1 < sVar4) {
        local_61 = result._M_current._6_1_ ^ 0xff;
      }
      if ((local_61 & 1) == 0) break;
      component((ComponentEntity *)&local_48,(size_t)this);
      this_00 = std::
                __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_48);
      result._M_current._6_1_ =
           containsComponent(&this_00->super_ComponentEntity,name,
                             (bool)(result._M_current._7_1_ & 1));
      std::shared_ptr<libcellml::Component>::~shared_ptr(&local_48);
      local_38 = local_38 + 1;
    }
  }
  return (bool)(result._M_current._6_1_ & 1);
}

Assistant:

bool ComponentEntity::containsComponent(const std::string &name, bool searchEncapsulated) const
{
    bool status = false;
    auto result = pFunc()->findComponent(name);
    if (result != pFunc()->mComponents.end()) {
        status = true;
    } else if (searchEncapsulated) {
        for (size_t i = 0; i < componentCount() && !status; ++i) {
            status = component(i)->containsComponent(name, searchEncapsulated);
        }
    }

    return status;
}